

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_TxInTest_Test::TestBody(ConfidentialTransaction_TxInTest_Test *this)

{
  AssertHelperData *pAVar1;
  undefined8 lhs;
  bool bVar2;
  undefined4 uVar3;
  AssertHelperData *pAVar4;
  ulong uVar5;
  char *pcVar6;
  _func_int *message;
  _func_int **pp_Var7;
  size_t sVar8;
  AssertionResult gtest_ar_2;
  uint32_t index;
  AssertionResult gtest_ar_1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ref_list;
  uint32_t add_index;
  AssertionResult gtest_ar_19;
  ConfidentialTransaction tx;
  ConfidentialTxInReference txin_ref;
  undefined1 local_3a8 [40];
  AssertHelper local_380;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  undefined1 local_370 [20];
  uint local_35c;
  undefined1 local_358 [40];
  uint32_t local_330;
  Script local_328;
  uint32_t local_2f0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_2c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_2b0;
  ConfidentialValue CStack_298;
  ConfidentialValue CStack_270;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_230;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> vStack_210;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_1f8;
  uint local_1dc;
  internal local_1d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  Txid local_1c8 [2];
  ConfidentialTxInReference local_188;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_1c8,2,0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::ConfidentialTransaction
                ((ConfidentialTransaction *)&local_188,(string *)&exp_tx_hex_abi_cxx11_);
      cfd::core::ConfidentialTransaction::operator=
                ((ConfidentialTransaction *)local_1c8,(ConfidentialTransaction *)&local_188);
      cfd::core::ConfidentialTransaction::~ConfidentialTransaction
                ((ConfidentialTransaction *)&local_188);
    }
  }
  else {
    testing::Message::Message((Message *)&local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xa6,
               "Expected: (tx = ConfidentialTransaction(exp_tx_hex)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (CONCAT71(local_188.super_AbstractTxInReference._vptr_AbstractTxInReference._1_7_,
                 (char)local_188.super_AbstractTxInReference._vptr_AbstractTxInReference) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_188.super_AbstractTxInReference._vptr_AbstractTxInReference._1_7_,
                           (char)local_188.super_AbstractTxInReference._vptr_AbstractTxInReference)
          != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_188.super_AbstractTxInReference.
                                       _vptr_AbstractTxInReference._1_7_,
                                       (char)local_188.super_AbstractTxInReference.
                                             _vptr_AbstractTxInReference) + 8))();
      }
    }
  }
  local_358._0_4_ = cfd::core::ConfidentialTransaction::GetTxInCount();
  local_3a8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_188,"tx.GetTxInCount()","1",(uint *)local_358,(int *)local_3a8);
  if ((char)local_188.super_AbstractTxInReference._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_358);
    if (local_188.super_AbstractTxInReference.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x43a303;
    }
    else {
      message = *local_188.super_AbstractTxInReference.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xa7,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188.super_AbstractTxInReference.txid_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&local_188);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::GetTxIn((uint)local_358);
    cfd::core::Txid::operator=(&local_188.super_AbstractTxInReference.txid_,(Txid *)(local_358 + 8))
    ;
    local_188.super_AbstractTxInReference.vout_ = local_330;
    cfd::core::Script::operator=
              (&local_188.super_AbstractTxInReference.unlocking_script_,&local_328);
    local_188.super_AbstractTxInReference.sequence_ = local_2f0;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&local_188.super_AbstractTxInReference.script_witness_.witness_stack_,&local_2e0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_188.blinding_nonce_.data_,&vStack_2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_188.asset_entropy_.data_,&vStack_2b0);
    cfd::core::ConfidentialValue::operator=(&local_188.issuance_amount_,&CStack_298);
    cfd::core::ConfidentialValue::operator=(&local_188.inflation_keys_,&CStack_270);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_188.issuance_amount_rangeproof_.data_,&vStack_248);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_188.inflation_keys_rangeproof_.data_,&vStack_230);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&local_188.pegin_witness_.witness_stack_,&vStack_210);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
              ((ConfidentialTxInReference *)local_358);
  }
  testing::Message::Message((Message *)local_358);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0xaa,
             "Expected: (txin_ref = tx.GetTxIn(1)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
  if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(undefined **)local_358._0_8_ + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetTxIn((uint)local_358);
      cfd::core::Txid::operator=
                (&local_188.super_AbstractTxInReference.txid_,(Txid *)(local_358 + 8));
      local_188.super_AbstractTxInReference.vout_ = local_330;
      cfd::core::Script::operator=
                (&local_188.super_AbstractTxInReference.unlocking_script_,&local_328);
      local_188.super_AbstractTxInReference.sequence_ = local_2f0;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_188.super_AbstractTxInReference.script_witness_.witness_stack_,&local_2e0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_188.blinding_nonce_.data_,&vStack_2c8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_188.asset_entropy_.data_,&vStack_2b0);
      cfd::core::ConfidentialValue::operator=(&local_188.issuance_amount_,&CStack_298);
      cfd::core::ConfidentialValue::operator=(&local_188.inflation_keys_,&CStack_270);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_188.issuance_amount_rangeproof_.data_,&vStack_248);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_188.inflation_keys_rangeproof_.data_,&vStack_230);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_188.pegin_witness_.witness_stack_,&vStack_210);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_358);
    }
  }
  else {
    testing::Message::Message((Message *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xab,
               "Expected: (txin_ref = tx.GetTxIn(0)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  cfd::core::Txid::Txid((Txid *)local_3a8,&local_188.super_AbstractTxInReference.txid_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetTxid().GetHex().c_str()",
             "\"56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31\"",
             (char *)local_358._0_8_,
             "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  pAVar1 = (AssertHelperData *)(local_358 + 0x10);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  local_3a8._0_8_ = &PTR__Txid_004ccb78;
  if ((pointer)local_3a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_3a8._8_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xae,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_4_ = local_188.super_AbstractTxInReference.vout_;
  local_380.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_358,"txin_ref.GetVout()","1",(uint *)local_3a8,(int *)&local_380);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xaf,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3a8._0_4_ = local_188.super_AbstractTxInReference.sequence_;
  local_380.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_358,"txin_ref.GetSequence()","0xffffffff",(uint *)local_3a8,
             (uint *)&local_380);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb0,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = (pointer)0x0;
  uVar5 = (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar5 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar5);
    sVar8 = (long)local_188.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_188.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8._16_8_ = uVar5 + (long)pAVar4;
  local_3a8._0_8_ = pAVar4;
  if (local_188.blinding_nonce_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_188.blinding_nonce_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8._8_8_ = pAVar4;
    memmove(pAVar4,local_188.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_3a8._8_8_ = (long)&pAVar4->type + sVar8;
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetBlindingNonce().GetHex().c_str()",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",
             (char *)local_358._0_8_,
             "0000000000000000000000000000000000000000000000000000000000000000");
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = (pointer)0x0;
  uVar5 = (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar5 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar5);
    sVar8 = (long)local_188.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_188.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8._16_8_ = uVar5 + (long)pAVar4;
  local_3a8._0_8_ = pAVar4;
  if (local_188.asset_entropy_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_188.asset_entropy_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8._8_8_ = pAVar4;
    memmove(pAVar4,local_188.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_3a8._8_8_ = (long)&pAVar4->type + sVar8;
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetAssetEntropy().GetHex().c_str()",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",
             (char *)local_358._0_8_,
             "0000000000000000000000000000000000000000000000000000000000000000");
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb6,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_358,&local_188.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetIssuanceAmount().GetHex().c_str()","\"\"",
             (char *)local_3a8._0_8_,"");
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)(local_3a8 + 0x10)) {
    operator_delete((void *)local_3a8._0_8_);
  }
  local_358._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_358._8_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb7,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_358,&local_188.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetInflationKeys().GetHex().c_str()","\"\"",
             (char *)local_3a8._0_8_,"");
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)(local_3a8 + 0x10)) {
    operator_delete((void *)local_3a8._0_8_);
  }
  local_358._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_358._8_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = (pointer)0x0;
  uVar5 = (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar5 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar5);
    sVar8 = (long)local_188.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_188.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8._16_8_ = uVar5 + (long)pAVar4;
  local_3a8._0_8_ = pAVar4;
  if (local_188.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_188.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8._8_8_ = pAVar4;
    memmove(pAVar4,local_188.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_3a8._8_8_ = (long)&pAVar4->type + sVar8;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetIssuanceAmountRangeproof().GetHex().c_str()","\"\""
             ,(char *)local_358._0_8_,"");
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb9,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = (pointer)0x0;
  uVar5 = (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar5 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar5);
    sVar8 = (long)local_188.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_188.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8._16_8_ = uVar5 + (long)pAVar4;
  local_3a8._0_8_ = pAVar4;
  if (local_188.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_188.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8._8_8_ = pAVar4;
    memmove(pAVar4,local_188.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_3a8._8_8_ = (long)&pAVar4->type + sVar8;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetInflationKeysRangeproof().GetHex().c_str()","\"\"",
             (char *)local_358._0_8_,"");
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xba,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_35c = 0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_35c = cfd::core::ConfidentialTransaction::GetTxInIndex(local_1c8,0x4e9ee8);
  }
  testing::Message::Message((Message *)local_358);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0xbf,
             "Expected: (index = tx.GetTxInIndex(exp_txid, exp_index)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
  if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(undefined **)local_358._0_8_ + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1dc = cfd::core::ConfidentialTransaction::AddTxIn
                            (local_1c8,0x4e9ee8,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message((Message *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc2,
               "Expected: (add_index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_35c = cfd::core::ConfidentialTransaction::GetTxInIndex(local_1c8,0x4e9ee8);
    }
  }
  else {
    testing::Message::Message((Message *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc3,
               "Expected: (index = tx.GetTxInIndex(exp_txid, exp_index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  local_3a8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_358,"add_index","1",&local_1dc,(int *)local_3a8);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc4,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3a8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_358,"index","1",&local_35c,(int *)local_3a8);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc5,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar3 = cfd::core::ConfidentialTransaction::GetTxInCount();
  local_3a8._0_4_ = uVar3;
  local_380.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_358,"tx.GetTxInCount()","2",(uint *)local_3a8,(int *)&local_380);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc6,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_35c = cfd::core::ConfidentialTransaction::GetTxInIndex(local_1c8,0x4e9ee8);
    }
  }
  else {
    testing::Message::Message((Message *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,200,
               "Expected: (index = tx.GetTxInIndex(exp_txid, exp_index | 0x80000000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  local_3a8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_358,"index","1",&local_35c,(int *)local_3a8);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc9,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_1f8.
  super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetTxInList();
      std::
      vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ::operator=(&local_1f8,
                  (vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                   *)local_358);
      std::
      vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                 *)local_358);
    }
  }
  else {
    testing::Message::Message((Message *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xcd,
               "Expected: (ref_list = tx.GetTxInList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  local_3a8._0_8_ =
       ((long)local_1f8.
              super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1f8.
              super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3;
  local_380.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_358,"ref_list.size()","2",(unsigned_long *)local_3a8,
             (int *)&local_380);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xce,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Txid::Txid
            ((Txid *)local_3a8,
             &((local_1f8.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxInReference).txid_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"ref_list[0].GetTxid().GetHex().c_str()",
             "\"56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31\"",
             (char *)local_358._0_8_,
             "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  local_3a8._0_8_ = &PTR__Txid_004ccb78;
  if ((pointer)local_3a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_3a8._8_8_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_4_ =
       ((local_1f8.
         super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxInReference).vout_;
  local_380.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_358,"ref_list[0].GetVout()","1",(uint *)local_3a8,(int *)&local_380);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd2,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3a8._0_4_ =
       ((local_1f8.
         super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxInReference).sequence_;
  local_380.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_358,"ref_list[0].GetSequence()","0xffffffff",(uint *)local_3a8,
             (uint *)&local_380);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd3,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Txid::Txid
            ((Txid *)local_3a8,
             &local_1f8.
              super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
              ._M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxInReference.txid_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  lhs = local_358._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_1d8,"ref_list[1].GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             (char *)lhs,(char *)CONCAT44(local_380.data_._4_4_,local_380.data_._0_4_));
  if ((undefined1 *)CONCAT44(local_380.data_._4_4_,local_380.data_._0_4_) != local_370) {
    operator_delete((undefined1 *)CONCAT44(local_380.data_._4_4_,local_380.data_._0_4_));
  }
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  local_3a8._0_8_ = &PTR__Txid_004ccb78;
  if ((pointer)local_3a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_3a8._8_8_);
  }
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if (local_1d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_1d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_4_ =
       local_1f8.
       super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ._M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxInReference.vout_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_358,"ref_list[1].GetVout()","exp_index",(uint *)local_3a8,&exp_index)
  ;
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd6,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3a8._0_4_ =
       local_1f8.
       super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ._M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxInReference.sequence_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_358,"ref_list[1].GetSequence()","exp_sequence",(uint *)local_3a8,
             &exp_sequence);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd7,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::RemoveTxIn((uint)local_1c8);
  }
  testing::Message::Message((Message *)local_358);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0xda,
             "Expected: (tx.RemoveTxIn(5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
  if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(undefined **)local_358._0_8_ + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::RemoveTxIn((uint)local_1c8);
    }
  }
  else {
    testing::Message::Message((Message *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xdb,
               "Expected: (tx.RemoveTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_358._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_358._0_8_ + 8))();
      }
    }
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetTxInCount();
  local_3a8._0_4_ = uVar3;
  local_380.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_358,"tx.GetTxInCount()","1",(uint *)local_3a8,(int *)&local_380);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a8);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      pp_Var7 = (_func_int **)0x43a303;
    }
    else {
      pp_Var7 = ((AbstractTxInReference *)local_358._8_8_)->_vptr_AbstractTxInReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xdc,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_358 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&local_1f8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_188);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_1c8)
  ;
  return;
}

Assistant:

TEST(ConfidentialTransaction, TxInTest) {
  ConfidentialTransaction tx(2, static_cast<uint32_t>(0));
  EXPECT_NO_THROW((tx = ConfidentialTransaction(exp_tx_hex)));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  // GetTxIn
  ConfidentialTxInReference txin_ref;
  EXPECT_THROW((txin_ref = tx.GetTxIn(1)), CfdException);
  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(0)));
  EXPECT_STREQ(
      txin_ref.GetTxid().GetHex().c_str(),
      "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  EXPECT_EQ(txin_ref.GetVout(), 1);
  EXPECT_EQ(txin_ref.GetSequence(), 0xffffffff);
  EXPECT_STREQ(
      txin_ref.GetBlindingNonce().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(
      txin_ref.GetAssetEntropy().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(txin_ref.GetIssuanceAmount().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetInflationKeys().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetIssuanceAmountRangeproof().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetInflationKeysRangeproof().GetHex().c_str(), "");

  // GetTxInIndex, AddTxIn
  uint32_t index = 0;
  uint32_t add_index;
  EXPECT_THROW((index = tx.GetTxInIndex(exp_txid, exp_index)), CfdException);

  EXPECT_NO_THROW(
      (add_index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW((index = tx.GetTxInIndex(exp_txid, exp_index)));
  EXPECT_EQ(add_index, 1);
  EXPECT_EQ(index, 1);
  EXPECT_EQ(tx.GetTxInCount(), 2);
  // mask check
  EXPECT_NO_THROW((index = tx.GetTxInIndex(exp_txid, exp_index | 0x80000000)));
  EXPECT_EQ(index, 1);

  // GetTxInList
  std::vector<ConfidentialTxInReference> ref_list;
  EXPECT_NO_THROW((ref_list = tx.GetTxInList()));
  EXPECT_EQ(ref_list.size(), 2);
  EXPECT_STREQ(
      ref_list[0].GetTxid().GetHex().c_str(),
      "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  EXPECT_EQ(ref_list[0].GetVout(), 1);
  EXPECT_EQ(ref_list[0].GetSequence(), 0xffffffff);
  EXPECT_STREQ(ref_list[1].GetTxid().GetHex().c_str(),
               exp_txid.GetHex().c_str());
  EXPECT_EQ(ref_list[1].GetVout(), exp_index);
  EXPECT_EQ(ref_list[1].GetSequence(), exp_sequence);

  // RemoveTxIn
  EXPECT_THROW((tx.RemoveTxIn(5)), CfdException);
  EXPECT_NO_THROW((tx.RemoveTxIn(1)));
  EXPECT_EQ(tx.GetTxInCount(), 1);
}